

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_interpreter_validateThenAnalyzeAndEvaluateASTWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t astNode,sysbvm_tuple_t environment)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t local_58;
  sysbvm_tuple_t local_50;
  sysbvm_tuple_t local_48;
  sysbvm_tuple_t sStack_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  local_20 = (undefined1 *)&local_58;
  local_48 = 0;
  sStack_40 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 4;
  local_58 = environment;
  local_50 = astNode;
  sysbvm_stackFrame_pushRecord(&local_38);
  sVar1 = sysbvm_tuple_getType(context,local_50);
  local_48 = sysbvm_type_getAstNodeValidationWithAnalysisAndEvaluationFunction(context,sVar1);
  if (local_48 == 0) {
    sVar1 = sysbvm_tuple_getType(context,local_50);
    local_48 = sysbvm_type_getAstNodeAnalysisAndEvaluationFunction(context,sVar1);
    if (local_48 == 0) {
      sysbvm_error("Cannot validate, analyze and evaluate non AST node tuple.");
    }
  }
  sStack_40 = sysbvm_function_applyNoCheck2(context,local_48,local_50,local_58);
  sysbvm_stackFrame_popRecord(&local_38);
  return sStack_40;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_validateThenAnalyzeAndEvaluateASTWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t astNode, sysbvm_tuple_t environment)
{
    struct {
        sysbvm_tuple_t environment;
        sysbvm_tuple_t astNode;
        sysbvm_tuple_t function;
        sysbvm_tuple_t result;
    } gcFrame = {
        .environment = environment,
        .astNode = astNode,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.function = sysbvm_type_getAstNodeValidationWithAnalysisAndEvaluationFunction(context, sysbvm_tuple_getType(context, gcFrame.astNode));
    if(!gcFrame.function)
    {
        gcFrame.function = sysbvm_type_getAstNodeAnalysisAndEvaluationFunction(context, sysbvm_tuple_getType(context, gcFrame.astNode));
        if(!gcFrame.function)
            sysbvm_error("Cannot validate, analyze and evaluate non AST node tuple.");
    }

    gcFrame.result = sysbvm_function_applyNoCheck2(context, gcFrame.function, gcFrame.astNode, gcFrame.environment);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}